

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::unloadwallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff578;
  uint uVar1;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff580;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b0;
  allocator<char> *in_stack_fffffffffffff5b8;
  char *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  string *in_stack_fffffffffffff5d0;
  undefined7 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5df;
  undefined4 in_stack_fffffffffffff5e0;
  Type in_stack_fffffffffffff5e4;
  string *in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5f0;
  Type in_stack_fffffffffffff5f4;
  undefined4 in_stack_fffffffffffff5f8;
  Type in_stack_fffffffffffff5fc;
  RPCResult *in_stack_fffffffffffff600;
  undefined1 *local_9e8;
  undefined1 *local_9d0;
  undefined1 *local_9b8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  allocator<char> local_84e;
  allocator<char> local_84d;
  allocator<char> local_84c;
  allocator<char> local_84b [3];
  pointer local_848;
  pointer pRStack_840;
  pointer local_838;
  allocator<char> local_82a;
  allocator<char> local_829 [9];
  undefined8 in_stack_fffffffffffff7e0;
  allocator<char> local_80a;
  allocator<char> local_809 [31];
  allocator<char> local_7ea;
  allocator<char> local_7e9 [31];
  undefined1 local_7ca;
  undefined1 local_7c9 [5];
  undefined1 local_7c4;
  undefined1 local_7c3;
  undefined1 local_7c2 [32];
  allocator<char> local_7a2;
  allocator<char> local_7a1 [321];
  undefined1 local_660 [136];
  undefined1 local_5d8 [64];
  undefined1 local_598 [136];
  undefined1 local_510 [200];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined1 local_320;
  undefined1 local_31f;
  undefined1 local_258 [264];
  vector<RPCArg,_std::allocator<RPCArg>_> local_150 [11];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  this_01 = (RPCHelpMan *)local_7c2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  name = (string *)&local_7c3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  local_360 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff590);
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff578);
  local_320 = 0;
  local_31f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8),
                 in_stack_fffffffffffff5d0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8));
  args = local_150;
  description = (string *)&local_7c4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  local_7c9._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff588,(Optional *)in_stack_fffffffffffff580);
  results = (RPCResults *)local_7c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff590);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff578);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8),
                 in_stack_fffffffffffff5d0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8));
  examples = (RPCExamples *)&local_7ca;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff578);
  __l._M_len._0_7_ = in_stack_fffffffffffff5c8;
  __l._M_array = (iterator)in_stack_fffffffffffff5c0;
  __l._M_len._7_1_ = in_stack_fffffffffffff5cf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5b8,__l,
             (allocator_type *)in_stack_fffffffffffff5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  local_848 = (pointer)0x0;
  pRStack_840 = (pointer)0x0;
  local_838 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff578);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
             (string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
             in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff578);
  uVar1 = (uint)((ulong)in_stack_fffffffffffff578 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff5c8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff5c0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff5cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5b8,__l_00,
             (allocator_type *)in_stack_fffffffffffff5b0);
  this = (allocator<RPCResult> *)((ulong)uVar1 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             in_stack_fffffffffffff5f4,in_stack_fffffffffffff5e8,
             SUB41(in_stack_fffffffffffff5e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d0,
             (bool)in_stack_fffffffffffff5cf);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff5c8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff5c0;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff5cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5b8,__l_01,
             (allocator_type *)in_stack_fffffffffffff5b0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
             (string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
             in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  HelpExampleCli(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),in_stack_fffffffffffff5c0
             ,in_stack_fffffffffffff5b8);
  HelpExampleRpc(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::operator+(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x9e6d61);
  this_00 = (RPCArg *)&stack0xfffffffffffff790;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::unloadwallet()::__0,void>
            (in_stack_fffffffffffff588,(anon_class_1_0_00000001 *)in_stack_fffffffffffff580);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff7e0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_84e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_84d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_84c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_84b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_9b8 = local_510;
  do {
    local_9b8 = local_9b8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_9b8 != local_598);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_9d0 = local_5d8;
  do {
    local_9d0 = local_9d0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_9d0 != local_660);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_82a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_829);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_80a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_809);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_7ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_7e9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_9e8 = local_48;
  do {
    local_9e8 = local_9e8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_9e8 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7c9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7c2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_7c2 + 1));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_7a2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_7a1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan unloadwallet()
{
    return RPCHelpMan{"unloadwallet",
                "Unloads the wallet referenced by the request endpoint, otherwise unloads the wallet specified in the argument.\n"
                "Specifying the wallet name on a wallet endpoint is invalid.",
                {
                    {"wallet_name", RPCArg::Type::STR, RPCArg::DefaultHint{"the wallet name from the RPC endpoint"}, "The name of the wallet to unload. If provided both here and in the RPC endpoint, the two must be identical."},
                    {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
                },
                RPCResult{RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to unloading the wallet.",
                    {
                        {RPCResult::Type::STR, "", ""},
                    }},
                }},
                RPCExamples{
                    HelpExampleCli("unloadwallet", "wallet_name")
            + HelpExampleRpc("unloadwallet", "wallet_name")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::string wallet_name;
    if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
        if (!(request.params[0].isNull() || request.params[0].get_str() == wallet_name)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "RPC endpoint wallet and wallet_name parameter specify different wallets");
        }
    } else {
        wallet_name = request.params[0].get_str();
    }

    WalletContext& context = EnsureWalletContext(request.context);
    std::shared_ptr<CWallet> wallet = GetWallet(context, wallet_name);
    if (!wallet) {
        throw JSONRPCError(RPC_WALLET_NOT_FOUND, "Requested wallet does not exist or is not loaded");
    }

    std::vector<bilingual_str> warnings;
    {
        WalletRescanReserver reserver(*wallet);
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
        }

        // Release the "main" shared pointer and prevent further notifications.
        // Note that any attempt to load the same wallet would fail until the wallet
        // is destroyed (see CheckUniqueFileid).
        std::optional<bool> load_on_start{self.MaybeArg<bool>("load_on_startup")};
        if (!RemoveWallet(context, wallet, load_on_start, warnings)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Requested wallet already unloaded");
        }
    }

    WaitForDeleteWallet(std::move(wallet));

    UniValue result(UniValue::VOBJ);
    PushWarnings(warnings, result);

    return result;
},
    };
}